

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O3

void __thiscall
markdown::token::HtmlAnchorTag::HtmlAnchorTag(HtmlAnchorTag *this,string *url,string *title)

{
  string *src;
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  anon_unknown_0::encodeString
            (&local_48,(anon_unknown_0 *)(url->_M_dataplus)._M_p,(string *)url->_M_string_length,9);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1575ef);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_d8 = *puVar4;
    lStack_d0 = plVar1[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar4;
    local_e8 = (ulong *)*plVar1;
  }
  local_e0 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  src = (string *)title->_M_string_length;
  if (src == (string *)0x0) {
    local_128 = &local_118;
    local_120 = 0;
    local_118 = local_118 & 0xffffffffffffff00;
  }
  else {
    anon_unknown_0::encodeString(&local_68,(anon_unknown_0 *)(title->_M_dataplus)._M_p,src,9);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1575f9);
    local_a8 = &local_98;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_98 = *plVar3;
      lStack_90 = plVar1[3];
    }
    else {
      local_98 = *plVar3;
      local_a8 = (long *)*plVar1;
    }
    local_a0 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_128 = &local_118;
    puVar4 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar4) {
      local_118 = *puVar4;
      lStack_110 = plVar1[3];
    }
    else {
      local_118 = *puVar4;
      local_128 = (ulong *)*plVar1;
    }
    local_120 = plVar1[1];
    *plVar1 = (long)puVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  uVar5 = 0xf;
  if (local_e8 != &local_d8) {
    uVar5 = local_d8;
  }
  if (uVar5 < (ulong)(local_120 + local_e0)) {
    uVar5 = 0xf;
    if (local_128 != &local_118) {
      uVar5 = local_118;
    }
    if ((ulong)(local_120 + local_e0) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_e8);
      goto LAB_0014d48d;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_128);
LAB_0014d48d:
  local_108 = &local_f8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_f8 = *plVar1;
    uStack_f0 = puVar2[3];
  }
  else {
    local_f8 = *plVar1;
    local_108 = (long *)*puVar2;
  }
  local_100 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_108);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_b8 = *plVar3;
    uStack_b0 = (undefined4)plVar1[3];
    uStack_ac = *(undefined4 *)((long)plVar1 + 0x1c);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar3;
    local_c8 = (long *)*plVar1;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_001662d0;
  (this->super_TextHolder).mText._M_dataplus._M_p = (pointer)&(this->super_TextHolder).mText.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_TextHolder).mText,local_c8,local_c0 + (long)local_c8);
  (this->super_TextHolder).mCanContainMarkup = false;
  (this->super_TextHolder).mEncodingFlags = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (src != (string *)0x0) {
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_00166800;
  return;
}

Assistant:

HtmlAnchorTag::HtmlAnchorTag(const std::string& url, const std::string& title):
	TextHolder("<a href=\""+encodeString(url, cQuotes|cAmps)+"\""
		+(title.empty() ? std::string() : " title=\""+encodeString(title, cQuotes|cAmps)+"\"")
		+">", false, 0)
{
	// This space deliberately blank. ;-)
}